

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageNotEqual(StackInterpreter *this)

{
  ulong *puVar1;
  StackMemory *pSVar2;
  ulong *puVar3;
  undefined8 *puVar4;
  size_t sVar5;
  Oop selector;
  uint uVar6;
  undefined8 *puVar7;
  uint uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  
  pSVar2 = this->stack;
  puVar3 = (ulong *)(pSVar2->stackFrame).stackPointer;
  puVar1 = puVar3 + 1;
  puVar7 = (undefined8 *)*puVar3;
  puVar4 = (undefined8 *)puVar3[1];
  uVar6 = (uint)puVar7;
  uVar8 = (uint)puVar4;
  if ((uVar6 & uVar8 & 1) == 0) {
    if ((uVar6 & 7) != 2 || (uVar8 & 7) != 2) {
      if ((((((ulong)puVar4 & 1) == 0) && ((uVar8 & 6) != 4)) &&
          ((((ulong)puVar4 & 6) != 0 || ((uint)((ulong)*puVar4 >> 0x2a) != 0x22)))) ||
         (((((ulong)puVar7 & 1) == 0 && ((uVar6 & 6) != 4)) &&
          ((((ulong)puVar7 & 6) != 0 || ((uint)((ulong)*puVar7 >> 0x2a) != 0x22)))))) {
        selector = VMContext::getSpecialMessageSelector(this->context,NotEqual);
        sendSelectorArgumentCount(this,selector,1,false);
        return;
      }
      sVar5 = this->pc;
      this->pc = sVar5 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar5);
      (pSVar2->stackFrame).stackPointer = (uint8_t *)(puVar3 + 2);
      if (((ulong)puVar4 & 1) == 0) {
        if ((uVar8 & 6) == 4) {
          uVar9 = ((ulong)puVar4 >> 3) + 0x7000000000000000;
          dVar11 = (double)(uVar9 >> 1 | (ulong)((uVar9 & 1) != 0) << 0x3f);
        }
        else {
          if ((((ulong)puVar4 & 6) != 0) || ((uint)((ulong)*puVar4 >> 0x2a) != 0x22))
          goto LAB_00147a35;
          dVar11 = (double)puVar4[1];
        }
      }
      else {
        dVar11 = (double)((long)puVar4 >> 1);
      }
      if (((ulong)puVar7 & 1) == 0) {
        if ((uVar6 & 6) == 4) {
          uVar9 = ((ulong)puVar7 >> 3) + 0x7000000000000000;
          dVar10 = (double)(uVar9 >> 1 | (ulong)((uVar9 & 1) != 0) << 0x3f);
        }
        else {
          if ((((ulong)puVar7 & 6) != 0) || ((uint)((ulong)*puVar7 >> 0x2a) != 0x22)) {
LAB_00147a35:
            __assert_fail("isFloatOrInt()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                          ,0x21e,"double Lodtalk::Oop::decodeFloatOrInt() const");
          }
          dVar10 = (double)puVar7[1];
        }
      }
      else {
        dVar10 = (double)((long)puVar7 >> 1);
      }
      puVar7 = &FalseObject;
      if (dVar11 != dVar10) {
        puVar7 = &TrueObject;
      }
      if (NAN(dVar11) || NAN(dVar10)) {
        puVar7 = &TrueObject;
      }
      (pSVar2->stackFrame).stackPointer = (uint8_t *)puVar1;
      *puVar1 = (ulong)puVar7;
      return;
    }
    sVar5 = this->pc;
    this->pc = sVar5 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar5);
    if ((int)((ulong)puVar4 >> 3) == (int)((ulong)puVar7 >> 3)) goto LAB_0014788a;
  }
  else {
    sVar5 = this->pc;
    this->pc = sVar5 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar5);
    if (((ulong)puVar7 ^ (ulong)puVar4) < 2) {
LAB_0014788a:
      puVar7 = &FalseObject;
      goto LAB_001478d9;
    }
  }
  puVar7 = &TrueObject;
LAB_001478d9:
  (pSVar2->stackFrame).stackPointer = (uint8_t *)puVar1;
  *puVar1 = (ulong)puVar7;
  return;
}

Assistant:

void interpretSpecialMessageNotEqual()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            pushBoolean(ia != ib);
        }
        else if(a.isCharacter() && b.isCharacter())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ca = a.decodeCharacter();
            auto cb = b.decodeCharacter();
            pushBoolean(ca != cb);
        }
        else if(a.isFloatOrInt() && b.isFloatOrInt())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto fa = a.decodeFloatOrInt();
            auto fb = b.decodeFloatOrInt();
            pushBoolean(fa != fb);
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::NotEqual, 1);
        }
    }